

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::MoveOptimizerPhasesToRoot(QueryProfiler *this)

{
  bool bVar1;
  pointer pPVar2;
  mapped_type *this_00;
  __node_base *p_Var3;
  Value VStack_68;
  
  pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
           operator->(&this->root);
  p_Var3 = &(this->phase_timings)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    bVar1 = ProfilingInfo::Enabled
                      (&(pPVar2->profiling_info).expanded_settings,
                       (MetricsType)*(size_type *)(p_Var3 + 1));
    if (bVar1) {
      Value::CreateValue<double>
                (&VStack_68,
                 (double)*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor);
      this_00 = ::std::__detail::
                _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(pPVar2->profiling_info).metrics,(key_type *)(p_Var3 + 1));
      Value::operator=(this_00,&VStack_68);
      Value::~Value(&VStack_68);
    }
  }
  return;
}

Assistant:

void QueryProfiler::MoveOptimizerPhasesToRoot() {
	auto &root_info = root->GetProfilingInfo();
	auto &root_metrics = root_info.metrics;

	for (auto &entry : phase_timings) {
		auto &phase = entry.first;
		auto &timing = entry.second;
		if (root_info.Enabled(root_info.expanded_settings, phase)) {
			root_metrics[phase] = Value::CreateValue(timing);
		}
	}
}